

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.h
# Opt level: O2

void __thiscall
miniscript::Node<CPubKey>::Node
          (Node<CPubKey> *this,MiniscriptContext param_2,Fragment param_3,uint32_t param_4)

{
  long lVar1;
  Type TVar2;
  size_t sVar3;
  long in_FS_OFFSET;
  WitnessSize WVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this->fragment = param_3;
  this->k = param_4;
  (this->keys).super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->keys).super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (this->keys).super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->subs).
  super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->subs).
  super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->subs).
  super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->m_script_ctx = param_2;
  CalcOps(&this->ops,this);
  CalcStackSize(&this->ss,this);
  WVar4 = CalcWitnessSize(this);
  this->ws = WVar4;
  TVar2 = CalcType(this);
  (this->typ).m_flags = TVar2.m_flags;
  sVar3 = CalcScriptLen(this);
  this->scriptlen = sVar3;
  (this->has_duplicate_keys).super__Optional_base<bool,_true,_true>._M_payload.
  super__Optional_payload_base<bool>._M_engaged = false;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Node(internal::NoDupCheck, MiniscriptContext script_ctx, Fragment nt, uint32_t val = 0)
        : fragment(nt), k(val), m_script_ctx{script_ctx}, ops(CalcOps()), ss(CalcStackSize()), ws(CalcWitnessSize()), typ(CalcType()), scriptlen(CalcScriptLen()) {}